

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O2

string * __thiscall
duckdb::TableRelation::GetAlias_abi_cxx11_(string *__return_storage_ptr__,TableRelation *this)

{
  pointer pTVar1;
  
  pTVar1 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(&this->description);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pTVar1->table);
  return __return_storage_ptr__;
}

Assistant:

string TableRelation::GetAlias() {
	return description->table;
}